

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

int wwCmp2(word *a,size_t n,word *b,size_t m)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (m < n) {
    if (n == m) {
      uVar3 = 1;
    }
    else {
      uVar4 = 0;
      do {
        uVar4 = uVar4 | a[n - 1];
        n = n - 1;
      } while (m != n);
      uVar3 = (uint)(uVar4 == 0);
    }
    uVar2 = wwCmp(a,b,m);
    uVar2 = uVar3 ^ 1 | -uVar3 & uVar2;
  }
  else {
    if (m <= n) {
      iVar1 = wwCmp(a,b,n);
      return iVar1;
    }
    if (n == m) {
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar4 = uVar4 | b[m - 1];
        m = m - 1;
      } while (n != m);
      uVar3 = -(uint)(uVar4 != 0);
    }
    uVar2 = wwCmp(a,b,n);
    uVar2 = uVar2 | uVar3;
  }
  return uVar2;
}

Assistant:

int SAFE(wwCmp2)(const word a[], size_t n, const word b[], size_t m)
{
	register int ret;
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	if (n > m)
	{
		register int z = wwIsZero(a + m, n - m);
		ret = wwCmp(a, b, m);
		ret = -z & ret | (z - 1) & 1;
		z = 0;
	}
	else if (n < m)
	{
		register int z = wwIsZero(b + n, m - n);
		ret = wwCmp(a, b, n);
		ret = -z & ret | (z - 1) & -1;
		z = 0;
	}
	else
		ret = wwCmp(a, b, n);
	return ret;
}